

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall DyndepParserTestImplicitOuts::Run(DyndepParserTestImplicitOuts *this)

{
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  iterator iVar4;
  
  iVar1 = g_current_test->assertion_failures_;
  DyndepParserTest::AssertParse
            (&this->super_DyndepParserTest,
             "ninja_dyndep_version = 1\nbuild out | impout1 impout2 : dyndep\n");
  if (iVar1 == g_current_test->assertion_failures_) {
    testing::Test::Check
              (g_current_test,
               (this->super_DyndepParserTest).dyndep_file_.
               super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_node_count == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
               ,0x1af,"1u == dyndep_file_.size()");
    iVar4 = std::
            _Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
            ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                    *)&(this->super_DyndepParserTest).dyndep_file_,
                   (this->super_DyndepParserTest).state_.edges_.
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (_Rb_tree_header *)iVar4._M_node !=
                       &(this->super_DyndepParserTest).dyndep_file_.
                        super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                        ._M_t._M_impl.super__Rb_tree_header,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                       ,0x1b1,"i != dyndep_file_.end()");
    if (bVar3) {
      testing::Test::Check
                (g_current_test,*(char *)((long)&iVar4._M_node[1]._M_parent + 1) == '\0',
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                 ,0x1b2,"false == i->second.restat_");
      bVar3 = testing::Test::Check
                        (g_current_test,
                         (long)iVar4._M_node[2]._M_left - (long)iVar4._M_node[2]._M_parent == 0x10,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                         ,0x1b3,"2u == i->second.implicit_outputs_.size()");
      pTVar2 = g_current_test;
      if (bVar3) {
        bVar3 = std::operator==("impout1",
                                *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  **)iVar4._M_node[2]._M_parent);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                   ,0x1b4,"\"impout1\" == i->second.implicit_outputs_[0]->path()");
        pTVar2 = g_current_test;
        bVar3 = std::operator==("impout2",
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar4._M_node[2]._M_parent)->_M_parent);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                   ,0x1b5,"\"impout2\" == i->second.implicit_outputs_[1]->path()");
        testing::Test::Check
                  (g_current_test,iVar4._M_node[1]._M_right == iVar4._M_node[1]._M_left,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
                   ,0x1b6,"0u == i->second.implicit_inputs_.size()");
        return;
      }
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, ImplicitOuts) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1\n"
"build out | impout1 impout2 : dyndep\n"));

  EXPECT_EQ(1u, dyndep_file_.size());
  DyndepFile::iterator i = dyndep_file_.find(state_.edges_[0]);
  ASSERT_NE(i, dyndep_file_.end());
  EXPECT_EQ(false, i->second.restat_);
  ASSERT_EQ(2u, i->second.implicit_outputs_.size());
  EXPECT_EQ("impout1", i->second.implicit_outputs_[0]->path());
  EXPECT_EQ("impout2", i->second.implicit_outputs_[1]->path());
  EXPECT_EQ(0u, i->second.implicit_inputs_.size());
}